

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node *psVar1;
  stbrp_context *psVar2;
  uint uVar3;
  int *piVar4;
  size_t __nmemb;
  size_t extraout_RAX;
  ulong uVar5;
  size_t extraout_RAX_00;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  stbrp_context *psVar11;
  stbrp_node *psVar12;
  stbrp_node **in_R8;
  stbrp_node *psVar13;
  stbrp_rect *psVar14;
  uint uVar15;
  stbrp_node **ppsVar16;
  stbrp_node **ppsVar17;
  ulong uVar18;
  stbrp_context *psVar19;
  int iVar20;
  bool bVar21;
  int waste;
  int local_98;
  uint local_94;
  stbrp_node **local_90;
  int local_88;
  int local_84;
  ulong local_80;
  uint local_74;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  stbrp_context *local_58;
  stbrp_node **local_50;
  ulong local_48;
  stbrp_rect *local_40;
  stbrp_rect *local_38;
  
  uVar18 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    piVar4 = &rects->was_packed;
    uVar6 = 0;
    do {
      *piVar4 = (int)uVar6;
      uVar6 = uVar6 + 1;
      piVar4 = piVar4 + 6;
    } while (uVar18 != uVar6);
  }
  __nmemb = (size_t)num_rects;
  local_70 = __nmemb;
  if (1 < (uint)num_rects) {
    qsort(rects,__nmemb,0x18,rect_height_compare);
    __nmemb = extraout_RAX;
  }
  if (0 < num_rects) {
    local_50 = &context->active_head;
    uVar6 = 0;
    ppsVar16 = local_50;
    local_74 = num_rects;
    local_58 = context;
    local_48 = uVar18;
    local_40 = rects;
    do {
      psVar14 = rects + uVar6;
      uVar10 = psVar14->w;
      uVar5 = (ulong)uVar10;
      ppsVar17 = ppsVar16;
      if (uVar10 == 0) {
LAB_0018a18c:
        psVar14->y = 0;
        __nmemb = 0;
        lVar7 = 0xc;
        local_90 = in_R8;
      }
      else {
        uVar15 = psVar14->h;
        local_80 = (ulong)uVar15;
        if (uVar15 == 0) goto LAB_0018a18c;
        iVar9 = context->align;
        iVar20 = uVar10 + iVar9 + -1;
        iVar20 = iVar20 - iVar20 % iVar9;
        local_68 = uVar5;
        local_60 = uVar6;
        local_38 = psVar14;
        if (iVar20 % iVar9 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_rectpack.h"
                        ,0x164,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        if ((context->width < iVar20) || (context->height < (int)uVar15)) {
          local_90 = (stbrp_node **)0x0;
          local_94 = 0;
          uVar10 = 0;
        }
        else {
          uVar15 = ((stbrp_context *)*ppsVar16)->width;
          if (context->width < (int)(uVar15 + iVar20)) {
            local_98 = 0x40000000;
            uVar10 = 0x40000000;
            local_90 = (stbrp_node **)0x0;
          }
          else {
            uVar10 = 0x40000000;
            local_90 = (stbrp_node **)0x0;
            local_98 = 0x40000000;
            psVar11 = (stbrp_context *)*ppsVar16;
            do {
              uVar15 = stbrp__skyline_find_min_y
                                 (psVar11,(stbrp_node *)(ulong)uVar15,iVar20,(int)&local_84,
                                  (int *)in_R8);
              if (context->heuristic == 0) {
                if ((int)uVar15 < (int)uVar10) {
                  local_90 = ppsVar17;
                  uVar10 = uVar15;
                }
              }
              else if (((int)((int)local_80 + uVar15) <= context->height) &&
                      (((int)uVar15 < (int)uVar10 || ((uVar15 == uVar10 && (local_84 < local_98)))))
                      ) {
                local_98 = local_84;
                local_90 = ppsVar17;
                uVar10 = uVar15;
              }
              ppsVar17 = (stbrp_node **)&psVar11->align;
              uVar15 = (*(stbrp_context **)&psVar11->align)->width;
              psVar11 = *(stbrp_context **)&psVar11->align;
            } while ((int)(uVar15 + iVar20) <= context->width);
          }
          if (local_90 == (stbrp_node **)0x0) {
            local_94 = 0;
          }
          else {
            local_94 = (*local_90)->x;
          }
          piVar4 = &context->heuristic;
          rects = local_40;
          context = local_58;
          ppsVar17 = local_50;
          uVar18 = local_48;
          num_rects = local_74;
          if (*piVar4 == 1) {
            psVar11 = (stbrp_context *)*ppsVar16;
            iVar9 = psVar11->width;
            psVar19 = psVar11;
            while (iVar9 < iVar20) {
              psVar19 = *(stbrp_context **)&psVar19->align;
              iVar9 = psVar19->width;
            }
            do {
              uVar15 = psVar19->width - iVar20;
              ppsVar17 = ppsVar16;
              psVar2 = psVar11;
              if ((int)uVar15 < 0) {
                __assert_fail("xpos >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_rectpack.h"
                              ,0x1a4,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              do {
                psVar11 = psVar2;
                ppsVar16 = ppsVar17;
                ppsVar17 = (stbrp_node **)&psVar11->align;
                psVar2 = *(stbrp_context **)&psVar11->align;
              } while ((*(stbrp_context **)&psVar11->align)->width <= (int)uVar15);
              if ((int)uVar15 < psVar11->width) {
                __assert_fail("node->next->x > xpos && node->x <= xpos",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_rectpack.h"
                              ,0x1aa,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              uVar3 = stbrp__skyline_find_min_y
                                (psVar11,(stbrp_node *)(ulong)uVar15,iVar20,(int)&local_88,
                                 (int *)in_R8);
              if ((((int)((int)local_80 + uVar3) <= local_58->height) && ((int)uVar3 <= (int)uVar10)
                  ) && ((((int)uVar3 < (int)uVar10 || (local_88 < local_98)) ||
                        ((local_88 == local_98 && ((int)uVar15 < (int)local_94)))))) {
                local_98 = local_88;
                local_94 = uVar15;
                local_90 = ppsVar16;
                uVar10 = uVar3;
              }
              psVar19 = *(stbrp_context **)&psVar19->align;
              rects = local_40;
              context = local_58;
              ppsVar17 = local_50;
              uVar18 = local_48;
              num_rects = local_74;
            } while (psVar19 != (stbrp_context *)0x0);
          }
        }
        uVar6 = local_60;
        psVar14 = local_38;
        if (local_90 == (stbrp_node **)0x0) {
LAB_0018a3d9:
          local_38->y = 0x7fffffff;
          __nmemb = 0x7fffffff;
          lVar7 = 0xc;
        }
        else {
          __nmemb = (size_t)uVar10;
          iVar9 = (int)local_80 + uVar10;
          if ((context->height < iVar9) ||
             (psVar1 = context->free_head, psVar1 == (stbrp_node *)0x0)) goto LAB_0018a3d9;
          psVar1->x = local_94;
          psVar1->y = iVar9;
          context->free_head = psVar1->next;
          psVar13 = *local_90;
          psVar12 = psVar13;
          if (psVar13->x < (int)local_94) {
            psVar12 = psVar13->next;
            local_90 = &psVar13->next;
          }
          *local_90 = psVar1;
          if (psVar12->next != (stbrp_node *)0x0) {
            local_90 = &psVar12->next;
            psVar13 = psVar12->next;
            do {
              if ((int)((int)local_68 + local_94) < psVar13->x) break;
              *local_90 = context->free_head;
              context->free_head = psVar12;
              local_90 = &psVar13->next;
              ppsVar16 = &psVar13->next;
              psVar12 = psVar13;
              psVar13 = *ppsVar16;
            } while (*ppsVar16 != (stbrp_node *)0x0);
          }
          psVar1->next = psVar12;
          iVar9 = (int)local_68 + local_94;
          if (psVar12->x < iVar9) {
            psVar12->x = iVar9;
          }
          local_38->x = local_94;
          lVar7 = 0x10;
        }
      }
      *(int *)((long)&psVar14->id + lVar7) = (int)__nmemb;
      uVar6 = uVar6 + 1;
      in_R8 = local_90;
      ppsVar16 = ppsVar17;
    } while (uVar6 != uVar18);
  }
  if (1 < (uint)num_rects) {
    qsort(rects,local_70,0x18,rect_original_order);
    __nmemb = extraout_RAX_00;
  }
  if (0 < num_rects) {
    __nmemb = uVar18 * 0x18;
    sVar8 = 0;
    do {
      bVar21 = true;
      if (*(int *)((long)&rects->x + sVar8) == 0x7fffffff) {
        bVar21 = *(int *)((long)&rects->y + sVar8) != 0x7fffffff;
      }
      *(uint *)((long)&rects->was_packed + sVar8) = (uint)bVar21;
      sVar8 = sVar8 + 0x18;
    } while (__nmemb != sVar8);
  }
  return (int)__nmemb;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}